

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseSelector(Parser *this,Selector *sel)

{
  bool bVar1;
  long in_FS_OFFSET;
  BasicSelector local_108;
  BasicSelector local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.elementName.d.d = (Data *)0x0;
  local_98.elementName.d.ptr = (char16_t *)0x0;
  local_98.elementName.d.size = 0;
  local_98.ids.d.d = (Data *)0x0;
  local_98.ids.d.ptr = (QString *)0x0;
  local_98.ids.d.size = 0;
  local_98.pseudos.d.d = (Data *)0x0;
  local_98.pseudos.d.ptr = (Pseudo *)0x0;
  local_98.pseudos.d.size = 0;
  local_98.attributeSelectors.d.d = (Data *)0x0;
  local_98.attributeSelectors.d.ptr = (AttributeSelector *)0x0;
  local_98.attributeSelectors.d.size = 0;
  local_98.relationToNext = NoRelation;
  local_98._100_4_ = 0xaaaaaaaa;
  bVar1 = parseSimpleSelector(this,&local_98);
  if (bVar1) {
    do {
      bVar1 = testCombinator(this);
      if (!bVar1) {
LAB_00546d2a:
        QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
                  (&sel->basicSelectors,&local_98);
        bVar1 = true;
        goto LAB_00546d39;
      }
      parseCombinator(this,&local_98.relationToNext);
      bVar1 = testSimpleSelector(this);
      if (!bVar1) goto LAB_00546d2a;
      QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
                (&sel->basicSelectors,&local_98);
      local_108.attributeSelectors.d.ptr = (AttributeSelector *)0x0;
      local_108.attributeSelectors.d.size = 0;
      local_108.pseudos.d.size = 0;
      local_108.attributeSelectors.d.d = (Data *)0x0;
      local_108.pseudos.d.d = (Data *)0x0;
      local_108.pseudos.d.ptr = (Pseudo *)0x0;
      local_108.ids.d.ptr = (QString *)0x0;
      local_108.ids.d.size = 0;
      local_108.elementName.d.size = 0;
      local_108.ids.d.d = (Data *)0x0;
      local_108.elementName.d.d = (Data *)0x0;
      local_108.elementName.d.ptr = (char16_t *)0x0;
      local_108.relationToNext = NoRelation;
      BasicSelector::operator=(&local_98,&local_108);
      BasicSelector::~BasicSelector(&local_108);
      bVar1 = parseSimpleSelector(this,&local_98);
    } while (bVar1);
  }
  bVar1 = false;
LAB_00546d39:
  BasicSelector::~BasicSelector(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseSelector(Selector *sel)
{
    BasicSelector basicSel;
    if (!parseSimpleSelector(&basicSel)) return false;
    while (testCombinator()) {
        if (!parseCombinator(&basicSel.relationToNext)) return false;

        if (!testSimpleSelector()) break;
        sel->basicSelectors.append(basicSel);

        basicSel = BasicSelector();
        if (!parseSimpleSelector(&basicSel)) return false;
    }
    sel->basicSelectors.append(basicSel);
    return true;
}